

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

bool __thiscall
spvtools::val::ValidationState_t::IsUnsignedIntCooperativeVectorNVType
          (ValidationState_t *this,uint32_t id)

{
  bool bVar1;
  Instruction *pIVar2;
  
  bVar1 = IsCooperativeVectorNVType(this,id);
  if (bVar1) {
    pIVar2 = FindDef(this,id);
    bVar1 = IsUnsignedIntScalarType
                      (this,(pIVar2->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[2]);
    return bVar1;
  }
  return false;
}

Assistant:

bool ValidationState_t::IsUnsignedIntCooperativeVectorNVType(
    uint32_t id) const {
  if (!IsCooperativeVectorNVType(id)) return false;
  return IsUnsignedIntScalarType(FindDef(id)->word(2));
}